

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O0

GCfunc * lj_func_newL_gc(lua_State *L,GCproto *pt,GCfuncL *parent)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  GCfunc *slot;
  lua_State *in_RDX;
  long in_RSI;
  long in_RDI;
  GCupval *uv;
  uint32_t v;
  TValue *base;
  MSize nuv;
  MSize i;
  GCRef *puv;
  GCfunc *fn;
  GCupval *local_48;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  GCproto *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar4;
  lua_State *L_00;
  
  if (*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x54) <=
      *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x50)) {
    lj_gc_step_fixtop((lua_State *)0x11c227);
  }
  slot = func_newL((lua_State *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8,
                   (GCtab *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  uVar2 = (uint)*(byte *)(in_RSI + 0x24);
  L_00 = in_RDX;
  for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
    uVar1 = *(ushort *)((ulong)*(uint *)(in_RSI + 0x14) + (ulong)uVar4 * 2);
    uVar3 = (uint)uVar1;
    if ((uVar1 & 0x8000) == 0) {
      local_48 = (GCupval *)(ulong)*(uint *)((long)&in_RDX->base + (ulong)uVar3 * 4 + 4);
    }
    else {
      local_48 = func_finduv(L_00,(TValue *)slot);
      local_48->immutable = (byte)(uVar3 >> 0xe) & 1;
      local_48->dhash = *(uint *)&L_00->base ^ uVar3 << 0x18;
    }
    *(int *)((long)slot + (ulong)uVar4 * 4 + 0x14) = (int)local_48;
  }
  (slot->c).nupvalues = (uint8_t)uVar2;
  return slot;
}

Assistant:

GCfunc *lj_func_newL_gc(lua_State *L, GCproto *pt, GCfuncL *parent)
{
  GCfunc *fn;
  GCRef *puv;
  MSize i, nuv;
  TValue *base;
  lj_gc_check_fixtop(L);
  fn = func_newL(L, pt, tabref(parent->env));
  /* NOBARRIER: The GCfunc is new (marked white). */
  puv = parent->uvptr;
  nuv = pt->sizeuv;
  base = L->base;
  for (i = 0; i < nuv; i++) {
    uint32_t v = proto_uv(pt)[i];
    GCupval *uv;
    if ((v & PROTO_UV_LOCAL)) {
      uv = func_finduv(L, base + (v & 0xff));
      uv->immutable = ((v / PROTO_UV_IMMUTABLE) & 1);
      uv->dhash = (uint32_t)(uintptr_t)mref(parent->pc, char) ^ (v << 24);
    } else {
      uv = &gcref(puv[v])->uv;
    }
    setgcref(fn->l.uvptr[i], obj2gco(uv));
  }
  fn->l.nupvalues = (uint8_t)nuv;
  return fn;
}